

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

lyxml_elem * lyxml_parse_path(ly_ctx *ctx,char *filename,int options)

{
  int fd;
  int iVar1;
  lyxml_elem *plVar2;
  char *format;
  size_t local_38;
  size_t length;
  char *addr;
  
  if (ctx == (ly_ctx *)0x0 || filename == (char *)0x0) {
    format = "Invalid arguments (%s()).";
    filename = "lyxml_parse_path";
    ctx = (ly_ctx *)0x0;
  }
  else {
    fd = open(filename,0);
    if (fd != -1) {
      iVar1 = lyp_mmap(ctx,fd,0,&local_38,(void **)&length);
      if (iVar1 == 0) {
        if (length != 0) {
          plVar2 = lyxml_parse_mem(ctx,(char *)length,options);
          lyp_munmap((void *)length,local_38);
          close(fd);
          return plVar2;
        }
      }
      else {
        ly_log(ctx,LY_LLERR,LY_ESYS,"Mapping file descriptor into memory failed (%s()).",
               "lyxml_parse_path");
      }
      close(fd);
      return (lyxml_elem *)0x0;
    }
    format = "Opening file \"%s\" failed.";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,format,filename);
  return (lyxml_elem *)0x0;
}

Assistant:

lyxml_elem *
lyxml_parse_path(struct ly_ctx *ctx, const char *filename, int options)
{
    struct lyxml_elem *elem = NULL;
    size_t length;
    int fd;
    char *addr;

    if (!filename || !ctx) {
        LOGARG;
        return NULL;
    }

    fd = open(filename, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_EINVAL,"Opening file \"%s\" failed.", filename);
        return NULL;
    }
    if (lyp_mmap(ctx, fd, 0, &length, (void **)&addr)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        goto error;
    } else if (!addr) {
        /* empty XML file */
        goto error;
    }

    elem = lyxml_parse_mem(ctx, addr, options);
    lyp_munmap(addr, length);
    close(fd);

    return elem;

error:
    if (fd != -1) {
        close(fd);
    }

    return NULL;
}